

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polymer.cpp
# Opt level: O0

void __thiscall
Genome::AddGene(Genome *this,string *name,int start,int stop,int rbs_start,int rbs_stop,
               double rbs_strength)

{
  allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>
  *paVar1;
  initializer_list<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>
  __l;
  initializer_list<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>
  __l_00;
  FixedElement *pFVar2;
  mapped_type *this_00;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>
  *local_220;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>
  *local_200;
  int local_1e4;
  int local_1e0;
  int local_1dc;
  undefined1 local_1d8 [8];
  shared_ptr<ReleaseSite> stop_codon;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a8;
  int local_188;
  int local_184;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_180;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_160;
  undefined1 local_140 [8];
  shared_ptr<BindingSite> rbs;
  double local_128;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>
  *local_120;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>
  local_118;
  iterator local_f0;
  size_type local_e8;
  undefined1 local_e0 [8];
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
  term;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>
  local_98;
  iterator local_70;
  size_type local_68;
  undefined1 local_60 [8];
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
  binding;
  double rbs_strength_local;
  int rbs_stop_local;
  int rbs_start_local;
  int stop_local;
  int start_local;
  string *name_local;
  Genome *this_local;
  
  binding._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)rbs_strength;
  rbs_strength_local._0_4_ = rbs_stop;
  rbs_strength_local._4_4_ = rbs_start;
  rbs_stop_local = stop;
  rbs_start_local = start;
  _stop_local = (_Base_ptr)name;
  name_local = (string *)this;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>
  ::pair<const_char_(&)[11],_double_&,_true>
            (&local_98,(char (*) [11])"__ribosome",
             (double *)&binding._M_t._M_impl.super__Rb_tree_header._M_node_count);
  local_70 = &local_98;
  local_68 = 1;
  paVar1 = (allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>
            *)((long)&term._M_t._M_impl.super__Rb_tree_header._M_node_count + 2);
  std::
  allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>
  ::allocator(paVar1);
  __l_00._M_len = local_68;
  __l_00._M_array = local_70;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
         *)local_60,__l_00,
        (less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *)
        ((long)&term._M_t._M_impl.super__Rb_tree_header._M_node_count + 3),paVar1);
  std::
  allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>
  ::~allocator((allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>
                *)((long)&term._M_t._M_impl.super__Rb_tree_header._M_node_count + 2));
  local_200 = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>
               *)&local_70;
  do {
    local_200 = local_200 + -1;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>
    ::~pair(local_200);
  } while (local_200 != &local_98);
  local_120 = &local_118;
  local_128 = 1.0;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>
  ::pair<const_char_(&)[11],_double,_true>(local_120,(char (*) [11])"__ribosome",&local_128);
  local_f0 = &local_118;
  local_e8 = 1;
  paVar1 = (allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>
            *)((long)&rbs.super___shared_ptr<BindingSite,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                      _M_pi + 6);
  std::
  allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>
  ::allocator(paVar1);
  __l._M_len = local_e8;
  __l._M_array = local_f0;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
         *)local_e0,__l,
        (less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *)
        ((long)&rbs.super___shared_ptr<BindingSite,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi +
        7),paVar1);
  std::
  allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>
  ::~allocator((allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>
                *)((long)&rbs.super___shared_ptr<BindingSite,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount._M_pi + 6));
  local_220 = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>
               *)&local_f0;
  do {
    local_220 = local_220 + -1;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>
    ::~pair(local_220);
  } while (local_220 != &local_118);
  std::operator+(&local_180,"__",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)_stop_local);
  std::operator+(&local_160,&local_180,"_rbs");
  std::
  make_shared<BindingSite,std::__cxx11::string,int&,int&,std::map<std::__cxx11::string,double,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,double>>>&>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_140,
             (int *)&local_160,(int *)((long)&rbs_strength_local + 4),
             (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
              *)&rbs_strength_local);
  std::__cxx11::string::~string((string *)&local_160);
  std::__cxx11::string::~string((string *)&local_180);
  pFVar2 = &std::__shared_ptr_access<BindingSite,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<BindingSite,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                       )local_140)->super_FixedElement;
  FixedElement::gene(pFVar2,(string *)_stop_local);
  pFVar2 = &std::__shared_ptr_access<BindingSite,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<BindingSite,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                       )local_140)->super_FixedElement;
  FixedElement::reading_frame(pFVar2,rbs_start_local % 3);
  pFVar2 = &std::__shared_ptr_access<BindingSite,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<BindingSite,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                       )local_140)->super_FixedElement;
  local_184 = FixedElement::start(pFVar2);
  pFVar2 = &std::__shared_ptr_access<BindingSite,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<BindingSite,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                       )local_140)->super_FixedElement;
  local_188 = FixedElement::stop(pFVar2);
  std::
  vector<Interval<std::shared_ptr<BindingSite>,unsigned_long>,std::allocator<Interval<std::shared_ptr<BindingSite>,unsigned_long>>>
  ::emplace_back<int,int,std::shared_ptr<BindingSite>&>
            ((vector<Interval<std::shared_ptr<BindingSite>,unsigned_long>,std::allocator<Interval<std::shared_ptr<BindingSite>,unsigned_long>>>
              *)&this->transcript_rbs_intervals_,&local_184,&local_188,
             (shared_ptr<BindingSite> *)local_140);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &stop_codon.super___shared_ptr<ReleaseSite,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                 ,"__",(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       _stop_local);
  std::operator+(&local_1a8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &stop_codon.super___shared_ptr<ReleaseSite,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                 ,"_rbs");
  this_00 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>_>_>_>
            ::operator[](&this->bindings_,&local_1a8);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
  ::operator=(this_00,(map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
                       *)local_60);
  std::__cxx11::string::~string((string *)&local_1a8);
  std::__cxx11::string::~string
            ((string *)
             &stop_codon.super___shared_ptr<ReleaseSite,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  local_1dc = rbs_stop_local + -1;
  std::
  make_shared<ReleaseSite,char_const(&)[11],int,int&,std::map<std::__cxx11::string,double,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,double>>>&>
            ((char (*) [11])local_1d8,(int *)"stop_codon",&local_1dc,
             (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
              *)&rbs_stop_local);
  pFVar2 = &std::__shared_ptr_access<ReleaseSite,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<ReleaseSite,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                       )local_1d8)->super_FixedElement;
  FixedElement::reading_frame(pFVar2,rbs_start_local % 3);
  pFVar2 = &std::__shared_ptr_access<ReleaseSite,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<ReleaseSite,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                       )local_1d8)->super_FixedElement;
  FixedElement::gene(pFVar2,(string *)_stop_local);
  pFVar2 = &std::__shared_ptr_access<ReleaseSite,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<ReleaseSite,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                       )local_1d8)->super_FixedElement;
  local_1e0 = FixedElement::start(pFVar2);
  pFVar2 = &std::__shared_ptr_access<ReleaseSite,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<ReleaseSite,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                       )local_1d8)->super_FixedElement;
  local_1e4 = FixedElement::stop(pFVar2);
  std::
  vector<Interval<std::shared_ptr<ReleaseSite>,unsigned_long>,std::allocator<Interval<std::shared_ptr<ReleaseSite>,unsigned_long>>>
  ::emplace_back<int,int,std::shared_ptr<ReleaseSite>&>
            ((vector<Interval<std::shared_ptr<ReleaseSite>,unsigned_long>,std::allocator<Interval<std::shared_ptr<ReleaseSite>,unsigned_long>>>
              *)&this->transcript_stop_site_intervals_,&local_1e0,&local_1e4,
             (shared_ptr<ReleaseSite> *)local_1d8);
  std::shared_ptr<ReleaseSite>::~shared_ptr((shared_ptr<ReleaseSite> *)local_1d8);
  std::shared_ptr<BindingSite>::~shared_ptr((shared_ptr<BindingSite> *)local_140);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
  ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
          *)local_e0);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
  ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
          *)local_60);
  return;
}

Assistant:

void Genome::AddGene(const std::string &name, int start, int stop,
                     int rbs_start, int rbs_stop, double rbs_strength) {
  auto binding = std::map<std::string, double>{{"__ribosome", rbs_strength}};
  auto term = std::map<std::string, double>{{"__ribosome", 1.0}};
  auto rbs = std::make_shared<BindingSite>("__" + name + "_rbs", rbs_start,
                                           rbs_stop, binding);
  rbs->gene(name);
  rbs->reading_frame(start % 3);
  transcript_rbs_intervals_.emplace_back(rbs->start(), rbs->stop(), rbs);
  bindings_["__" + name + "_rbs"] = binding;
  auto stop_codon =
      std::make_shared<ReleaseSite>("stop_codon", stop - 1, stop, term);
  stop_codon->reading_frame(start % 3);
  stop_codon->gene(name);
  transcript_stop_site_intervals_.emplace_back(stop_codon->start(),
                                               stop_codon->stop(), stop_codon);
}